

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingParserTarget::MakeNamedMaterial
          (FormattingParserTarget *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  ParameterDictionary *in_RSI;
  long in_RDI;
  string matName;
  string extra;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_00000908;
  string *in_stack_00000910;
  FormattingParserTarget *in_stack_00000918;
  FileLoc in_stack_00000930;
  ParameterDictionary *in_stack_fffffffffffffc48;
  ParameterDictionary *in_stack_fffffffffffffc50;
  ParsedParameter *__lhs;
  polymorphic_allocator<pbrt::ParsedParameter_*> *in_stack_fffffffffffffc60;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc68;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc70;
  FormattingParserTarget *in_stack_fffffffffffffc78;
  RGBColorSpace *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ParsedParameterVector *in_stack_fffffffffffffc88;
  ParameterDictionary *in_stack_fffffffffffffc90;
  string *def;
  mapped_type *in_stack_fffffffffffffca0;
  ParameterDictionary *in_stack_fffffffffffffca8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcb0;
  ParameterDictionary *in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  int indentCount;
  ParameterDictionary *this_00;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [39];
  undefined1 local_269 [65];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_201 [40];
  undefined1 local_1d9 [33];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [36];
  int local_134;
  string local_130 [32];
  _Self local_110;
  _Self local_108 [31];
  ParameterDictionary *local_10;
  
  indentCount = (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
  this_00 = (ParameterDictionary *)&stack0x00000008;
  local_10 = in_RSI;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_fffffffffffffc50);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffc50->params);
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    indent_abi_cxx11_(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffc90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80);
    std::__cxx11::string::~string(local_178);
  }
  else {
    ParameterDictionary::RenameUsedTextures(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    iVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffc48,(key_type *)0x762435);
    local_108[0]._M_node = iVar2._M_node;
    local_110._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffc48);
    indentCount = (int)((ulong)iVar2._M_node >> 0x20);
    bVar1 = std::operator!=(local_108,&local_110);
    if (bVar1) {
      Warning<std::__cxx11::string_const&>
                ((FileLoc *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc80);
      local_134 = MakeNamedMaterial::count;
      MakeNamedMaterial::count = MakeNamedMaterial::count + 1;
      StringPrintf<std::__cxx11::string_const&,int>
                ((char *)in_stack_fffffffffffffc78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc70,(int *)in_stack_fffffffffffffc68);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffc90,(key_type *)in_stack_fffffffffffffc88);
      std::__cxx11::string::operator=((string *)pmVar3,local_130);
      std::__cxx11::string::~string(local_130);
    }
    else {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffc90,(key_type *)in_stack_fffffffffffffc88);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_10);
      in_stack_fffffffffffffca8 = local_10;
    }
    indent_abi_cxx11_(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    in_stack_fffffffffffffca0 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffc90,(key_type *)in_stack_fffffffffffffc88);
    Printf<std::__cxx11::string,std::__cxx11::string&>
              ((char *)in_stack_fffffffffffffc90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80);
    std::__cxx11::string::~string(local_158);
  }
  std::__cxx11::string::string(local_198);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    def = (string *)local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               (allocator<char> *)in_stack_fffffffffffffc80);
    in_stack_fffffffffffffc90 = (ParameterDictionary *)local_201;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
               (allocator<char> *)in_stack_fffffffffffffc80);
    ParameterDictionary::GetOneString(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,def);
    std::__cxx11::string::~string((string *)(local_201 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_201);
    std::__cxx11::string::~string((string *)(local_1d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1d9);
    __lhs = (this_00->params).field_2.fixed[0];
    in_stack_fffffffffffffc48 = (ParameterDictionary *)(this_00->params).alloc.memoryResource;
    in_stack_fffffffffffffc50 = (ParameterDictionary *)(this_00->params).ptr;
    local_269._33_8_ = in_stack_fffffffffffffc48;
    local_269._41_8_ = in_stack_fffffffffffffc50;
    local_269._49_8_ = __lhs;
    upgradeMaterial(in_stack_00000918,in_stack_00000910,in_stack_00000908,in_stack_00000930);
    __rhs = &local_228;
    std::__cxx11::string::operator=(local_198,(string *)__rhs);
    std::__cxx11::string::~string((string *)__rhs);
    in_stack_fffffffffffffc88 = (ParsedParameterVector *)local_269;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,(allocator<char> *)__rhs)
    ;
    ParameterDictionary::RemoveString(in_stack_fffffffffffffc50,(string *)in_stack_fffffffffffffc48)
    ;
    std::__cxx11::string::~string((string *)(local_269 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_269);
    indent_abi_cxx11_(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    StringPrintf<std::__cxx11::string&>
              ((char *)in_stack_fffffffffffffc78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc88,__rhs);
    std::operator+(&__lhs->type,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc50);
    std::__cxx11::string::operator=(local_198,local_290);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::~string(local_2f0);
    std::__cxx11::string::~string(local_2d0);
    std::__cxx11::string::~string(local_1b8);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,local_198);
  ParameterDictionary::ToParameterList_abi_cxx11_(this_00,indentCount);
  std::operator<<(poVar4,local_310);
  std::__cxx11::string::~string(local_310);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc90,(key_type *)in_stack_fffffffffffffc88);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::ParameterDictionary>_>_>
                  *)in_stack_fffffffffffffc90,(key_type *)in_stack_fffffffffffffc88);
    ParameterDictionary::operator=(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  std::__cxx11::string::~string(local_198);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x762bad);
  return;
}

Assistant:

void FormattingParserTarget::MakeNamedMaterial(const std::string &name,
                                               ParsedParameterVector params,
                                               FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);

    if (upgrade) {
        dict.RenameUsedTextures(definedTextures);

        if (definedNamedMaterials.find(name) != definedNamedMaterials.end()) {
            static int count = 0;
            Warning(&loc, "%s: renaming multiply-defined named material", name);
            definedNamedMaterials[name] = StringPrintf("%s-renamed-%d", name, count++);
        } else
            definedNamedMaterials[name] = name;
        Printf("%sMakeNamedMaterial \"%s\"\n", indent(), definedNamedMaterials[name]);
    } else
        Printf("%sMakeNamedMaterial \"%s\"\n", indent(), name);

    std::string extra;
    if (upgrade) {
        std::string matName = dict.GetOneString("type", "");
        extra = upgradeMaterial(&matName, &dict, loc);
        dict.RemoveString("type");
        extra = indent(1) + StringPrintf("\"string type\" [ \"%s\" ]\n", matName) + extra;
    }
    std::cout << extra << dict.ToParameterList(catIndentCount);

    if (upgrade)
        namedMaterialDictionaries[definedNamedMaterials[name]] = std::move(dict);
}